

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void async_func_free(JSRuntime *rt,JSAsyncFunctionState *s)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValueUnion JVar1;
  long in_RSI;
  JSValue *sp;
  JSStackFrame *sf;
  JSStackFrame *in_stack_00000028;
  JSRuntime *in_stack_00000030;
  void *in_stack_ffffffffffffffd8;
  JSRuntime *in_stack_ffffffffffffffe0;
  
  JVar1.ptr = (void *)(in_RSI + 0x18);
  close_var_refs(in_stack_00000030,in_stack_00000028);
  if (*(long *)((long)JVar1.ptr + 0x18) != 0) {
    for (in_stack_ffffffffffffffe0 = *(JSRuntime **)((long)JVar1.ptr + 0x18);
        in_stack_ffffffffffffffe0 < *(JSRuntime **)((long)JVar1.ptr + 0x48);
        in_stack_ffffffffffffffe0 = (JSRuntime *)&(in_stack_ffffffffffffffe0->mf).js_realloc) {
      v.tag = in_RSI;
      v.u.ptr = JVar1.ptr;
      JS_FreeValueRT(in_stack_ffffffffffffffe0,v);
    }
    js_free_rt(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  v_00.tag = in_RSI;
  v_00.u.ptr = JVar1.ptr;
  JS_FreeValueRT(in_stack_ffffffffffffffe0,v_00);
  v_01.tag = in_RSI;
  v_01.u.ptr = JVar1.ptr;
  JS_FreeValueRT(in_stack_ffffffffffffffe0,v_01);
  return;
}

Assistant:

static void async_func_free(JSRuntime *rt, JSAsyncFunctionState *s)
{
    JSStackFrame *sf;
    JSValue *sp;

    sf = &s->frame;

    /* close the closure variables. */
    close_var_refs(rt, sf);
    
    if (sf->arg_buf) {
        /* cannot free the function if it is running */
        assert(sf->cur_sp != NULL);
        for(sp = sf->arg_buf; sp < sf->cur_sp; sp++) {
            JS_FreeValueRT(rt, *sp);
        }
        js_free_rt(rt, sf->arg_buf);
    }
    JS_FreeValueRT(rt, sf->cur_func);
    JS_FreeValueRT(rt, s->this_val);
}